

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::resizeEvent(QListView *this,QResizeEvent *e)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  State SVar5;
  QListViewPrivate *pQVar6;
  QSize *this_00;
  QResizeEvent *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  bool flowDimensionChanged;
  bool listWrap;
  QListViewPrivate *d;
  QSize delta;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 uVar7;
  byte bVar8;
  int delay;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  byte bVar9;
  undefined1 in_stack_ffffffffffffffd7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QListView *)0x87919f);
  if (((pQVar6->super_QAbstractItemViewPrivate).delayedPendingLayout & 1U) != 0) goto LAB_008792da;
  this_00 = QResizeEvent::size(in_RSI);
  QResizeEvent::oldSize(in_RSI);
  ::operator-((QSize *)CONCAT17(in_stack_ffffffffffffffd7,
                                CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
              in_RDI);
  delay = (int)((ulong)in_RDI >> 0x20);
  bVar2 = QSize::isNull((QSize *)CONCAT17(in_stack_ffffffffffffffd7,
                                          CONCAT16(in_stack_ffffffffffffffd6,
                                                   in_stack_ffffffffffffffd0)));
  if (bVar2) goto LAB_008792da;
  bVar8 = 0;
  if (pQVar6->viewMode == ListMode) {
    bVar8 = (pQVar6->super_QAbstractItemViewPrivate).wrapItemText;
  }
  bVar3 = bVar8 & 1;
  if (pQVar6->flow == LeftToRight) {
    iVar4 = QSize::width((QSize *)0x879248);
    uVar7 = true;
    if (iVar4 == 0) goto LAB_00879255;
  }
  else {
LAB_00879255:
    in_stack_ffffffffffffffbd = false;
    uVar7 = in_stack_ffffffffffffffbd;
    if (pQVar6->flow == TopToBottom) {
      iVar4 = QSize::height((QSize *)0x879273);
      in_stack_ffffffffffffffbd = iVar4 != 0;
      uVar7 = in_stack_ffffffffffffffbd;
    }
  }
  bVar9 = uVar7;
  if (((bVar3 & 1) == 0) &&
     (((SVar5 = QAbstractItemView::state((QAbstractItemView *)this_00), SVar5 != NoState ||
       (pQVar6->resizeMode != Adjust)) || ((bVar9 & 1) == 0)))) {
    QAbstractItemView::resizeEvent
              ((QAbstractItemView *)this_00,
               (QResizeEvent *)
               CONCAT17(bVar8,CONCAT16(uVar7,CONCAT15(in_stack_ffffffffffffffbd,
                                                      in_stack_ffffffffffffffb8))));
  }
  else {
    QAbstractItemViewPrivate::doDelayedItemsLayout
              ((QAbstractItemViewPrivate *)CONCAT17(bVar3,CONCAT16(bVar9,in_stack_ffffffffffffffd0))
               ,delay);
  }
LAB_008792da:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::resizeEvent(QResizeEvent *e)
{
    Q_D(QListView);
    if (d->delayedPendingLayout)
        return;

    QSize delta = e->size() - e->oldSize();

    if (delta.isNull())
      return;

    bool listWrap = (d->viewMode == ListMode) && d->wrapItemText;
    bool flowDimensionChanged = (d->flow == LeftToRight && delta.width() != 0)
                                || (d->flow == TopToBottom && delta.height() != 0);

    // We post a delayed relayout in the following cases :
    // - we're wrapping
    // - the state is NoState, we're adjusting and the size has changed in the flowing direction
    if (listWrap
        || (state() == NoState && d->resizeMode == Adjust && flowDimensionChanged)) {
        d->doDelayedItemsLayout(100); // wait 1/10 sec before starting the layout
    } else {
        QAbstractItemView::resizeEvent(e);
    }
}